

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

wstring * __thiscall
PDA::Transducer::Register::toString_abi_cxx11_(wstring *__return_storage_ptr__,Register *this)

{
  unsigned_short uVar1;
  Size SVar2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> bStack_58;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  if (this->integer != true) {
    return __return_storage_ptr__;
  }
  uVar1 = this->argumentIndex;
  switch(uVar1) {
  case 0:
    SVar2 = this->size;
    break;
  case 1:
    SVar2 = this->size;
    break;
  case 2:
    SVar2 = this->size;
    break;
  case 3:
    SVar2 = this->size;
    break;
  case 4:
    SVar2 = this->size;
    break;
  case 5:
    SVar2 = this->size;
    break;
  default:
    if (uVar1 == 0x52) {
      SVar2 = this->size;
    }
    else if (uVar1 == 0x51) {
      SVar2 = this->size;
    }
    else {
      if (uVar1 != 0x50) goto LAB_00126e6d;
      SVar2 = this->size;
    }
  }
  if (SVar2 < 4) {
    std::__cxx11::wstring::assign((wchar_t *)__return_storage_ptr__);
  }
LAB_00126e6d:
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::operator+(&local_38,L'%',__return_storage_ptr__);
    std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_38);
    std::__cxx11::wstring::~wstring((wstring *)&local_38);
    if (this->isPtr == true) {
      std::operator+(&bStack_58,L'(',__return_storage_ptr__);
      std::operator+(&local_38,&bStack_58,L')');
      std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_38);
      std::__cxx11::wstring::~wstring((wstring *)&local_38);
      std::__cxx11::wstring::~wstring((wstring *)&bStack_58);
      if (this->ptrOffset != 0) {
        std::__cxx11::to_wstring(&bStack_58,this->ptrOffset);
        std::operator+(&local_38,&bStack_58,__return_storage_ptr__);
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_38);
        std::__cxx11::wstring::~wstring((wstring *)&local_38);
        std::__cxx11::wstring::~wstring((wstring *)&bStack_58);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Register::toString() const
{
    // rdi rsi rdx rcx r8 r9 || xmm0-7
    std::wstring result;
    if (integer)
    {
        switch(argumentIndex)
        {
        case ReturnType:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rax";
                break; case Size::Half:
                result = L"eax";
                break; case Size::Quarter:
                result = L"ax";
                break; case Size::OneEight:
                result = L"al";
            }
            break;
        }
        case StackBase:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rbp";
                break; case Size::Half:
                result = L"ebp";
                break; case Size::Quarter:
                result = L"bp";
                break; case Size::OneEight:
                result = L"bpl";
            }
            break;
        }
        case StackTop:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rsp";
                break; case Size::Half:
                result = L"esp";
                break; case Size::Quarter:
                result = L"sp";
                break; case Size::OneEight:
                result = L"spl";
            }
            break;
        }
        case 0:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rdi";
                break; case Size::Half:
                result = L"edi";
                break; case Size::Quarter:
                result = L"di";
                break; case Size::OneEight:
                result = L"dil";
            }
            break;
        }
        case 1:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rsi";
                break; case Size::Half:
                result = L"esi";
                break; case Size::Quarter:
                result = L"si";
                break; case Size::OneEight:
                result = L"sil";
            }
            break;
        }
        case 2:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rdx";
                break; case Size::Half:
                result = L"edx";
                break; case Size::Quarter:
                result = L"dx";
                break; case Size::OneEight:
                result = L"dl";
            }
            break;
        }
        case 3:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rcx";
                break; case Size::Half:
                result = L"ecx";
                break; case Size::Quarter:
                result = L"cx";
                break; case Size::OneEight:
                result = L"cl";
            }
            break;
        }
        case 4:
        {
            switch(size)
            {
            case Size::Full:
                result = L"r8";
                break; case Size::Half:
                result = L"r8d";
                break; case Size::Quarter:
                result = L"r8w";
                break; case Size::OneEight:
                result = L"r8b";
            }
            break;
        }
        case 5:
        {
            switch(size)
            {
            case Size::Full:
                result = L"r9";
                break; case Size::Half:
                result = L"r9d";
                break; case Size::Quarter:
                result = L"r9w";
                break; case Size::OneEight:
                result = L"r9b";
            }
            break;
        }
        }
    }

    if (!result.empty())
    {
        result = L'%' + result;
        if (isPtr)
        {
            result = L'(' + result + L')';
            if (ptrOffset != 0)
                result = std::to_wstring(ptrOffset) + result;
        }
    }

    return result;
}